

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhostinfo.cpp
# Opt level: O2

void __thiscall QHostInfoResult::postResultsReady(QHostInfoResult *this,QHostInfo *info)

{
  bool bVar1;
  QHostInfoResult *this_00;
  long in_FS_OFFSET;
  code *local_30;
  undefined8 local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  if ((this->slotObj)._M_t.
      super___uniq_ptr_impl<QtPrivate::QSlotObjectBase,_QtPrivate::QSlotObjectBase::Deleter>._M_t.
      super__Tuple_impl<0UL,_QtPrivate::QSlotObjectBase_*,_QtPrivate::QSlotObjectBase::Deleter>.
      super__Head_base<0UL,_QtPrivate::QSlotObjectBase_*,_false>._M_head_impl ==
      (QSlotObjectBase *)0x0) {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
      resultsReady(this,info);
      return;
    }
  }
  else {
    bVar1 = QPointer::operator_cast_to_bool((QPointer *)&this->receiver);
    if (bVar1) {
      this_00 = (QHostInfoResult *)operator_new(0x28);
      QHostInfoResult(this_00,this);
      local_30 = finalizePostResultsReady;
      local_28 = 0;
      QMetaObject::invokeMethod<void(QHostInfoResult::*)(QHostInfo_const&),QHostInfo_const&>
                (this_00,(offset_in_QHostInfoResult_to_subr *)&local_30,QueuedConnection,info);
    }
    if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
      return;
    }
  }
  __stack_chk_fail();
}

Assistant:

void QHostInfoResult::postResultsReady(const QHostInfo &info)
{
    // queued connection will take care of dispatching to right thread
    if (!slotObj) {
        emit resultsReady(info);
        return;
    }
    // we used to have a context object, but it's already destroyed
    if (!receiver)
        return;

    // a long-living version of this
    auto result = new QHostInfoResult(this);
    Q_CHECK_PTR(result);

    QMetaObject::invokeMethod(result,
                              &QHostInfoResult::finalizePostResultsReady,
                              Qt::QueuedConnection,
                              info);
}